

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O2

void __thiscall
directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
for_each_cell<directed_flag_complex_in_memory_computer::compute_filtration_t>
          (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *this,compute_filtration_t *f,
          int min_dimension,int max_dimension)

{
  initializer_list<directed_flag_complex_in_memory_computer::compute_filtration_t> __l;
  allocator_type local_71;
  vector<directed_flag_complex_in_memory_computer::compute_filtration_t,_std::allocator<directed_flag_complex_in_memory_computer::compute_filtration_t>_>
  fs;
  compute_filtration_t local_58;
  
  directed_flag_complex_in_memory_computer::compute_filtration_t::compute_filtration_t(&local_58,f);
  __l._M_len = 1;
  __l._M_array = &local_58;
  std::
  vector<directed_flag_complex_in_memory_computer::compute_filtration_t,_std::allocator<directed_flag_complex_in_memory_computer::compute_filtration_t>_>
  ::vector(&fs,__l,&local_71);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&local_58.next_filtration.super__Vector_base<float,_std::allocator<float>_>);
  for_each_cell<directed_flag_complex_in_memory_computer::compute_filtration_t>
            (this,&fs,min_dimension,max_dimension);
  std::
  vector<directed_flag_complex_in_memory_computer::compute_filtration_t,_std::allocator<directed_flag_complex_in_memory_computer::compute_filtration_t>_>
  ::~vector(&fs);
  return;
}

Assistant:

void for_each_cell(Func& f, int min_dimension, int max_dimension = -1) {
		std::vector<Func> fs{{f}};
		for_each_cell(fs, min_dimension, max_dimension);
	}